

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::coarseTimeStep(Amr *this,Real stop_time)

{
  Real *x;
  ostringstream *poVar1;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  Long LVar8;
  Print *pPVar9;
  FILE *pFVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  Long max_fab_kilobytes;
  Long min_fab_kilobytes;
  Print local_340;
  stringstream stepName;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stepName);
  poVar7 = std::operator<<(local_1a8,"timeStep STEP ");
  std::ostream::operator<<
            (poVar7,*(this->level_steps).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start);
  dVar18 = second();
  _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (((this->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  if (*(this->level_steps).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start < 1) {
    (**(code **)(*(long *)_Var2.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x68))
              (stop_time,
               _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
               *(undefined4 *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
               this->sub_cycle,&this->n_cycle,
               &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio,&this->dt_level);
  }
  else {
    (**(code **)(*(long *)_Var2.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x70))
              (stop_time);
  }
  (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x11])(this->cumtime,stop_time,this,0,1);
  puVar3 = (this->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this->cumtime =
       *(this->dt_level).super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       + this->cumtime;
  (**(code **)(*(long *)(puVar3->_M_t).
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
              + 0x88))();
  x = &this->cumtime;
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    dVar19 = second();
    iVar6 = *(this->level_steps).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    poVar7 = OutStream();
    Print::Print(&local_340,poVar7);
    poVar1 = &local_340.ss;
    std::operator<<((ostream *)poVar1,"\n[STEP ");
    std::ostream::operator<<(poVar1,iVar6);
    std::operator<<((ostream *)poVar1,"] Coarse TimeStep time: ");
    std::ostream::_M_insert<double>(dVar19 - dVar18);
    std::operator<<((ostream *)poVar1,'\n');
    Print::~Print(&local_340);
    LVar8 = TotalBytesAllocatedInFabsHWM();
    max_fab_kilobytes = LVar8 / 0x400;
    min_fab_kilobytes = max_fab_kilobytes;
    ParallelDescriptor::ReduceLongMin(&min_fab_kilobytes,0);
    ParallelDescriptor::ReduceLongMax(&max_fab_kilobytes,0);
    poVar7 = OutStream();
    Print::Print(&local_340,poVar7);
    poVar1 = &local_340.ss;
    std::operator<<((ostream *)poVar1,"[STEP ");
    std::ostream::operator<<(poVar1,iVar6);
    std::operator<<((ostream *)poVar1,"] FAB kilobyte spread across MPI nodes: [");
    std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<((ostream *)poVar1," ... ");
    std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<((ostream *)poVar1,"]\n");
    Print::~Print(&local_340);
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      poVar7 = OutStream();
      Print::Print(&local_340,poVar7);
      std::operator<<((ostream *)&local_340.ss,"\nSTEP = ");
      pPVar9 = Print::operator<<(&local_340,
                                 (this->level_steps).super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
      std::operator<<((ostream *)&pPVar9->ss," TIME = ");
      pPVar9 = Print::operator<<(pPVar9,x);
      std::operator<<((ostream *)&pPVar9->ss," DT = ");
      pPVar9 = Print::operator<<(pPVar9,(this->dt_level).
                                        super_vector<double,_std::allocator<double>_>.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
      std::operator<<((ostream *)&pPVar9->ss,"\n\n");
      Print::~Print(&local_340);
    }
  }
  if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    poVar7 = std::operator<<((ostream *)&this->runlog,"STEP = ");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,*(this->level_steps).super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
    std::operator<<(poVar7," TIME = ");
    poVar7 = std::ostream::_M_insert<double>(*x);
    std::operator<<(poVar7," DT = ");
    poVar7 = std::ostream::_M_insert<double>
                       (*(this->dt_level).super_vector<double,_std::allocator<double>_>.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::operator<<(poVar7,'\n');
  }
  if ((this->record_run_info_terse != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (&this->runlog_terse,
                        *(this->level_steps).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::operator<<(poVar7," ");
    poVar7 = std::ostream::_M_insert<double>(*x);
    std::operator<<(poVar7," ");
    poVar7 = std::ostream::_M_insert<double>
                       (*(this->dt_level).super_vector<double,_std::allocator<double>_>.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::operator<<(poVar7,'\n');
  }
  dVar18 = this->check_per;
  bVar17 = false;
  bVar14 = false;
  if (0.0 < dVar18) {
    dVar19 = this->cumtime;
    dVar20 = dVar19 - *(this->dt_level).super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
    auVar21._8_8_ = dVar20;
    auVar21._0_8_ = dVar19;
    auVar22._8_4_ = SUB84(dVar18,0);
    auVar22._0_8_ = dVar18;
    auVar22._12_4_ = (int)((ulong)dVar18 >> 0x20);
    auVar22 = divpd(auVar21,auVar22);
    iVar23 = (int)auVar22._8_8_;
    iVar6 = iVar23 + 1;
    iVar11 = (int)auVar22._0_8_;
    if ((((int)auVar22._0_8_ == iVar23) &&
        (iVar11 = iVar6, iVar12 = iVar23,
        ABS(dVar19) * 2.220446049250313e-15 < ABS(dVar19 - (double)iVar6 * dVar18))) ||
       (iVar12 = iVar11, ABS(dVar19) * 2.220446049250313e-15 < ABS(dVar20 - (double)iVar6 * dVar18))
       ) {
      iVar11 = iVar12;
      iVar6 = iVar23;
    }
    bVar14 = iVar6 != iVar11;
  }
  if (((this->message_int < 1) ||
      (*(this->level_steps).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start %
       this->message_int != 0)) || (*(int *)(ParallelContext::frames + 0xc) != 0)) {
    bVar16 = false;
    bVar4 = false;
    bVar5 = true;
  }
  else {
    pcVar13 = "dump_and_continue";
    pFVar10 = fopen("dump_and_continue","r");
    bVar15 = pFVar10 == (FILE *)0x0;
    if (bVar15) {
      pcVar13 = "stop_run";
      pFVar10 = fopen("stop_run","r");
      if (pFVar10 != (FILE *)0x0) {
        bVar5 = true;
        bVar17 = true;
        goto LAB_004788dc;
      }
      pcVar13 = "dump_and_stop";
      pFVar10 = fopen("dump_and_stop","r");
      bVar5 = false;
      bVar4 = false;
      bVar17 = true;
      if (pFVar10 != (FILE *)0x0) goto LAB_004788dc;
      bVar5 = true;
      bVar15 = false;
    }
    else {
      bVar5 = false;
      bVar17 = false;
LAB_004788dc:
      bVar4 = bVar17;
      remove(pcVar13);
      fclose(pFVar10);
    }
    pFVar10 = fopen("plot_and_continue","r");
    bVar16 = pFVar10 != (FILE *)0x0;
    if (bVar16) {
      remove("plot_and_continue");
      fclose(pFVar10);
    }
    pFVar10 = fopen("small_plot_and_continue","r");
    bVar17 = pFVar10 != (FILE *)0x0;
    if (bVar17) {
      remove("small_plot_and_continue");
      fclose(pFVar10);
    }
    if ((bool)(bVar15 & bVar5)) {
      iVar6 = *(this->level_steps).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      this->last_checkpoint = iVar6;
      this->last_plotfile = iVar6;
      bVar4 = true;
      bVar5 = true;
    }
  }
  iVar6 = this->write_plotfile_with_checkpoint;
  if (this->check_int < 1) {
    if (!(bool)(bVar14 | bVar5 ^ 1U)) goto LAB_004787b5;
  }
  else if ((!bVar14 && bVar5) &&
           *(this->level_steps).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start %
           this->check_int != 0) goto LAB_004787b5;
  (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xf])(this);
LAB_004787b5:
  bVar15 = (bool)(~bVar5 & iVar6 != 0);
  bVar14 = writePlotNow(this);
  if ((bVar14) || (bVar16 || bVar15)) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])(this);
  }
  bVar14 = writeSmallPlotNow(this);
  if ((bVar14) || (bVar17 || bVar15)) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xe])(this);
  }
  this->bUserStopRequest = bVar4;
  if (bVar4) {
    std::__cxx11::string::string
              ((string *)&local_340,"Amr::coarseTimeStep::to_stop",(allocator *)&min_fab_kilobytes);
    ParallelDescriptor::Barrier((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    if (*(int *)(ParallelContext::frames + 0xc) == 0) {
      if (bVar5) {
        poVar7 = ErrorStream();
        pcVar13 = "Stopped by user w/o checkpoint";
      }
      else {
        poVar7 = ErrorStream();
        pcVar13 = "Stopped by user w/ checkpoint";
      }
      poVar7 = std::operator<<(poVar7,pcVar13);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stepName);
  return;
}

Assistant:

void
Amr::coarseTimeStep (Real stop_time)
{
    double run_stop;
    double run_strt;
    BL_PROFILE_REGION_START("Amr::coarseTimeStep()");
    BL_PROFILE("Amr::coarseTimeStep()");
    std::stringstream stepName;
    stepName << "timeStep STEP " << level_steps[0];

    run_strt = amrex::second() ;

    //
    // Compute new dt.
    //
    if (levelSteps(0) > 0)
    {
        int post_regrid_flag = 0;
        amr_level[0]->computeNewDt(finest_level,
                                   sub_cycle,
                                   n_cycle,
                                   ref_ratio,
                                   dt_min,
                                   dt_level,
                                   stop_time,
                                   post_regrid_flag);
    }
    else
    {
        amr_level[0]->computeInitialDt(finest_level,
                                       sub_cycle,
                                       n_cycle,
                                       ref_ratio,
                                       dt_level,
                                       stop_time);
    }

    BL_PROFILE_REGION_START(stepName.str());
    timeStep(0,cumtime,1,1,stop_time);
    BL_PROFILE_REGION_STOP(stepName.str());

    cumtime += dt_level[0];

    amr_level[0]->postCoarseTimeStep(cumtime);


    if (verbose > 0)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        run_stop = amrex::second() - run_strt;
        const int istep    = level_steps[0];

#ifdef BL_LAZY
        Lazy::QueueReduction( [=] () mutable {
#endif
            ParallelDescriptor::ReduceRealMax(run_stop,IOProc);
            amrex::Print() << "\n[STEP " << istep << "] Coarse TimeStep time: " << run_stop << '\n';
#ifdef BL_LAZY
        });
#endif

#ifndef AMREX_MEM_PROFILING
        Long min_fab_kilobytes  = amrex::TotalBytesAllocatedInFabsHWM()/1024;
        Long max_fab_kilobytes  = min_fab_kilobytes;

#ifdef BL_LAZY
        Lazy::QueueReduction( [=] () mutable {
#endif
            ParallelDescriptor::ReduceLongMin(min_fab_kilobytes, IOProc);
            ParallelDescriptor::ReduceLongMax(max_fab_kilobytes, IOProc);

            amrex::Print() << "[STEP " << istep << "] FAB kilobyte spread across MPI nodes: ["
                           << min_fab_kilobytes << " ... " << max_fab_kilobytes << "]\n";
#ifdef BL_LAZY
            amrex::Print() << "\n";
            });
#endif
#endif
    }

#ifdef AMREX_MEM_PROFILING
    {
        std::ostringstream ss;
        ss << "[STEP " << level_steps[0] << "]";
        MemProfiler::report(ss.str());
    }
#endif

    BL_PROFILE_ADD_STEP(level_steps[0]);
    BL_PROFILE_REGION_STOP("Amr::coarseTimeStep()");
    BL_COMM_PROFILE_NAMETAG(stepName.str());
    //BL_PROFILE_FLUSH();
    BL_TRACE_PROFILE_FLUSH();
    BL_COMM_PROFILE_FLUSH();

    if (verbose > 0)
    {
        amrex::Print()
            << "\nSTEP = " << level_steps[0]
            << " TIME = "  << cumtime
            << " DT = "    << dt_level[0] << "\n\n";
    }
    if (record_run_info && ParallelDescriptor::IOProcessor())
    {
        runlog << "STEP = "  << level_steps[0]
               << " TIME = " << cumtime
               << " DT = "   << dt_level[0] << '\n';
    }
    if (record_run_info_terse && ParallelDescriptor::IOProcessor())
        runlog_terse << level_steps[0] << " " << cumtime << " " << dt_level[0] << '\n';

    int check_test = 0;

    if (check_per > 0.0)
    {

        // Check to see if we've crossed a check_per interval by comparing
        // the number of intervals that have elapsed for both the current
        // time and the time at the beginning of this timestep.

        int num_per_old = static_cast<int>((cumtime-dt_level[0]) / check_per);
        int num_per_new = static_cast<int>((cumtime            ) / check_per);

        // Before using these, however, we must test for the case where we're
        // within machine epsilon of the next interval. In that case, increment
        // the counter, because we have indeed reached the next check_per interval
        // at this point.

        const Real eps = std::numeric_limits<Real>::epsilon() * 10.0_rt * std::abs(cumtime);
        const Real next_chk_time = (num_per_old + 1) * check_per;

        if ((num_per_new == num_per_old) && std::abs(cumtime - next_chk_time) <= eps)
        {
            num_per_new += 1;
        }

        // Similarly, we have to account for the case where the old time is within
        // machine epsilon of the beginning of this interval, so that we don't double
        // count that time threshold -- we already plotted at that time on the last timestep.

        if ((num_per_new != num_per_old) && std::abs((cumtime - dt_level[0]) - next_chk_time) <= eps)
        {
            num_per_old += 1;
        }

        if (num_per_old != num_per_new)
        {
            check_test = 1;
        }

    }

    int to_stop       = 0;
    int to_checkpoint = 0;
    int to_plot       = 0;
    int to_small_plot = 0;
    if (message_int > 0 && level_steps[0] % message_int == 0) {
        if (ParallelDescriptor::IOProcessor())
        {
            FILE *fp;
            if ((fp=fopen("dump_and_continue","r")) != 0)
            {
                remove("dump_and_continue");
                to_checkpoint = 1;
                fclose(fp);
            }
            else if ((fp=fopen("stop_run","r")) != 0)
            {
                remove("stop_run");
                to_stop = 1;
                fclose(fp);
            }
            else if ((fp=fopen("dump_and_stop","r")) != 0)
            {
                remove("dump_and_stop");
                to_checkpoint = 1;
                to_stop = 1;
                fclose(fp);
            }

            if ((fp=fopen("plot_and_continue","r")) != 0)
            {
                remove("plot_and_continue");
                to_plot = 1;
                fclose(fp);
            }

            if ((fp=fopen("small_plot_and_continue","r")) != 0)
            {
                remove("small_plot_and_continue");
                to_small_plot = 1;
                fclose(fp);
            }
        }
        int packed_data[4];
        packed_data[0] = to_stop;
        packed_data[1] = to_checkpoint;
        packed_data[2] = to_plot;
        packed_data[3] = to_small_plot;
        ParallelDescriptor::Bcast(packed_data, 4, ParallelDescriptor::IOProcessorNumber());
        to_stop = packed_data[0];
        to_checkpoint = packed_data[1];
        to_plot = packed_data[2];
        to_small_plot = packed_data[3];

    }

    if(to_stop == 1 && to_checkpoint == 0) {  // prevent main from writing files
        last_checkpoint = level_steps[0];
        last_plotfile   = level_steps[0];
    }

    if (to_checkpoint && write_plotfile_with_checkpoint) {
        to_plot = 1;
        to_small_plot = 1;
    }

    if ((check_int > 0 && level_steps[0] % check_int == 0) || check_test == 1
        || to_checkpoint)
    {
        checkPoint();
    }


    if (writePlotNow() || to_plot)
    {
        writePlotFile();
    }

    if (writeSmallPlotNow() || to_small_plot)
    {
        writeSmallPlotFile();
    }

    updateInSitu();

    bUserStopRequest = to_stop;
    if (to_stop)
    {
        ParallelDescriptor::Barrier("Amr::coarseTimeStep::to_stop");
        if(ParallelDescriptor::IOProcessor()) {
            if (to_checkpoint)
            {
                amrex::ErrorStream() << "Stopped by user w/ checkpoint" << std::endl;
            }
            else
            {
                amrex::ErrorStream() << "Stopped by user w/o checkpoint" << std::endl;
            }
        }
    }
}